

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromHexadecimalString
          (IEEEFloat *this,StringRef s,roundingMode rounding_mode)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  opStatus oVar6;
  char *pcVar7;
  ExponentType EVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  iterator pcVar12;
  long lVar13;
  int iVar14;
  Significand *pSVar15;
  int iVar16;
  char *pcVar17;
  iterator end;
  lostFraction local_74;
  char *local_68;
  iterator dot;
  ulong local_50;
  char *local_48;
  char *local_40;
  IEEEFloat *local_38;
  
  pcVar12 = s.Data;
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  zeroSignificand(this);
  this->exponent = 0;
  uVar9 = this->semantics->precision;
  if (uVar9 - 0x40 < 0xffffff80) {
    pSVar15 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar15 = &this->significand;
  }
  uVar9 = uVar9 & 0xffffffc0;
  local_50 = (ulong)uVar9;
  end = pcVar12 + s.Length;
  local_48 = pcVar12;
  local_38 = this;
  local_40 = skipLeadingZeroesAndAnyDot(pcVar12,end,&dot);
  bVar3 = false;
  local_68 = dot;
  local_74 = lfExactlyZero;
  pcVar12 = local_40;
  uVar9 = uVar9 + 0x40;
LAB_00192034:
  do {
    pcVar7 = pcVar12;
    lVar13 = 0;
    while( true ) {
      pcVar17 = pcVar7 + lVar13;
      if (pcVar17 == end) {
        __assert_fail("p != end && \"Hex strings require an exponent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x90d,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                     );
      }
      if (*pcVar17 == '.') {
        if (local_68 != end) {
          __assert_fail("dot == end && \"String contains multiple dots\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x8f6,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                       );
        }
        local_68 = pcVar7 + lVar13;
        pcVar12 = pcVar7 + lVar13 + 1;
        dot = local_68;
        goto LAB_00192034;
      }
      uVar4 = hexDigitValue(*pcVar17);
      if (uVar4 == 0xffffffff) {
        if ((byte)(pcVar7[lVar13] | 0x20U) != 0x70) {
          __assert_fail("(*p == \'p\' || *p == \'P\') && \"Invalid character in significand\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x90e,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                       );
        }
        if (pcVar17 == local_48) {
          __assert_fail("p != begin && \"Significand has no digits\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x90f,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                       );
        }
        if (pcVar17 + ~(ulong)local_48 == (char *)0x0 && local_68 != end) {
          __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x910,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                       );
        }
        if (pcVar17 == local_40) goto LAB_0019225a;
        pcVar12 = pcVar17;
        if (local_68 != end) {
          pcVar17 = local_68;
          pcVar12 = dot;
        }
        dot = pcVar12;
        pcVar11 = pcVar7 + lVar13 + 1;
        if (pcVar11 == end) {
          __assert_fail("p != end && \"Exponent has no digits\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xf6,
                        "int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
        }
        cVar1 = *pcVar11;
        if (((cVar1 == '+') || (cVar1 == '-')) && (pcVar11 = pcVar7 + lVar13 + 2, pcVar11 == end)) {
          __assert_fail("p != end && \"Exponent has no digits\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfb,
                        "int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
        }
        iVar16 = (int)pcVar17 - (int)local_40;
        iVar16 = (local_38->semantics->precision - (int)local_50) + (iVar16 - (iVar16 >> 0x1f)) * 4
                 + -0x41;
        iVar14 = 0;
        goto LAB_001921e9;
      }
      if (uVar9 == 0) break;
      uVar9 = uVar9 - 4;
      pSVar15[uVar9 >> 6].part = pSVar15[uVar9 >> 6].part | (ulong)uVar4 << ((byte)uVar9 & 0x3f);
      lVar13 = lVar13 + 1;
    }
    bVar2 = !bVar3;
    bVar3 = true;
    pcVar12 = pcVar7 + lVar13 + 1;
    uVar9 = 0;
    if (bVar2) {
      pcVar12 = pcVar7 + lVar13 + 1;
      bVar3 = true;
      local_74 = lfMoreThanHalf;
      uVar9 = 0;
      if ((uVar4 < 9) && (local_74 = lfLessThanHalf, pcVar7 = pcVar12, (uVar4 & 7) == 0)) {
        while( true ) {
          if (pcVar7 == end) {
            __assert_fail("p != end && \"Invalid trailing hexadecimal fraction!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0x194,
                          "lostFraction llvm::trailingHexadecimalFraction(StringRef::iterator, StringRef::iterator, unsigned int)"
                         );
          }
          cVar1 = *pcVar7;
          if ((cVar1 != '0') && (cVar1 != '.')) break;
          pcVar7 = pcVar7 + 1;
        }
        uVar5 = hexDigitValue(cVar1);
        uVar9 = 0;
        if (uVar5 == 0xffffffff) {
          local_74 = (uint)(uVar4 != 0) * 2;
        }
        else {
          local_74 = (uint)(uVar4 != 0) * 2 + lfLessThanHalf;
        }
      }
    }
  } while( true );
  while( true ) {
    if (9 < (int)*pcVar11 - 0x30U) {
      __assert_fail("value < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x104,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)")
      ;
    }
    iVar14 = ((int)*pcVar11 - 0x30U) + iVar14 * 10;
    pcVar11 = pcVar11 + 1;
    if (0x7fff < iVar14) break;
LAB_001921e9:
    if (pcVar11 == end) {
      if (((short)iVar16 == iVar16) && (pcVar11 == end)) {
        iVar10 = -iVar14;
        if (cVar1 != '-') {
          iVar10 = iVar14;
        }
        iVar14 = 0x7fff;
        if (cVar1 == '-') {
          iVar14 = -0x8000;
        }
        iVar10 = iVar10 + iVar16;
        if ((short)iVar10 != iVar10) {
          iVar10 = iVar14;
        }
        EVar8 = (ExponentType)iVar10;
        goto LAB_00192256;
      }
      break;
    }
  }
  EVar8 = 0x7fff;
  if (cVar1 == '-') {
    EVar8 = -0x8000;
  }
LAB_00192256:
  local_38->exponent = EVar8;
LAB_0019225a:
  oVar6 = normalize(local_38,rounding_mode,local_74);
  return oVar6;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromHexadecimalString(StringRef s,
                                        roundingMode rounding_mode) {
  lostFraction lost_fraction = lfExactlyZero;

  category = fcNormal;
  zeroSignificand();
  exponent = 0;

  integerPart *significand = significandParts();
  unsigned partsCount = partCount();
  unsigned bitPos = partsCount * integerPartWidth;
  bool computedTrailingFraction = false;

  // Skip leading zeroes and any (hexa)decimal point.
  StringRef::iterator begin = s.begin();
  StringRef::iterator end = s.end();
  StringRef::iterator dot;
  StringRef::iterator p = skipLeadingZeroesAndAnyDot(begin, end, &dot);
  StringRef::iterator firstSignificantDigit = p;

  while (p != end) {
    integerPart hex_value;

    if (*p == '.') {
      assert(dot == end && "String contains multiple dots");
      dot = p++;
      continue;
    }

    hex_value = hexDigitValue(*p);
    if (hex_value == -1U)
      break;

    p++;

    // Store the number while we have space.
    if (bitPos) {
      bitPos -= 4;
      hex_value <<= bitPos % integerPartWidth;
      significand[bitPos / integerPartWidth] |= hex_value;
    } else if (!computedTrailingFraction) {
      lost_fraction = trailingHexadecimalFraction(p, end, hex_value);
      computedTrailingFraction = true;
    }
  }

  /* Hex floats require an exponent but not a hexadecimal point.  */
  assert(p != end && "Hex strings require an exponent");
  assert((*p == 'p' || *p == 'P') && "Invalid character in significand");
  assert(p != begin && "Significand has no digits");
  assert((dot == end || p - begin != 1) && "Significand has no digits");

  /* Ignore the exponent if we are zero.  */
  if (p != firstSignificantDigit) {
    int expAdjustment;

    /* Implicit hexadecimal point?  */
    if (dot == end)
      dot = p;

    /* Calculate the exponent adjustment implicit in the number of
       significant digits.  */
    expAdjustment = static_cast<int>(dot - firstSignificantDigit);
    if (expAdjustment < 0)
      expAdjustment++;
    expAdjustment = expAdjustment * 4 - 1;

    /* Adjust for writing the significand starting at the most
       significant nibble.  */
    expAdjustment += semantics->precision;
    expAdjustment -= partsCount * integerPartWidth;

    /* Adjust for the given exponent.  */
    exponent = totalExponent(p + 1, end, expAdjustment);
  }

  return normalize(rounding_mode, lost_fraction);
}